

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void * Js::InterpreterStackFrame::GetAsmJsInterpreterEntryPoint(AsmJsCallStackLayout *stack)

{
  code *pcVar1;
  bool bVar2;
  Which WVar3;
  FunctionBody *this;
  AsmJsFunctionInfo *this_00;
  undefined4 *puVar4;
  AsmJsRetType local_24;
  code *local_20;
  void *entryPoint;
  JavascriptFunction *function;
  AsmJsCallStackLayout *stack_local;
  
  entryPoint = stack->functionObject;
  local_20 = (code *)0x0;
  function = (JavascriptFunction *)stack;
  this = JavascriptFunction::GetFunctionBody((JavascriptFunction *)entryPoint);
  this_00 = FunctionBody::GetAsmJsFunctionInfo(this);
  local_24 = AsmJsFunctionInfo::GetReturnType(this_00);
  WVar3 = AsmJsRetType::which(&local_24);
  switch(WVar3) {
  case Int64:
    local_20 = AsmJsInterpreter<long>;
    break;
  case Double:
    local_20 = AsmJsInterpreter<double>;
    break;
  case Float:
    local_20 = AsmJsInterpreter<float>;
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x904,"((0))","(0)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
    break;
  case Signed:
  case Void:
    local_20 = AsmJsInterpreter<int>;
    break;
  case Int32x4:
  case Uint32x4:
  case Int16x8:
  case Int8x16:
  case Uint16x8:
  case Uint8x16:
  case Bool32x4:
  case Bool16x8:
  case Bool8x16:
  case Float32x4:
  case Float64x2:
    local_20 = AsmJsInterpreterSimdJs;
  }
  return local_20;
}

Assistant:

void * InterpreterStackFrame::GetAsmJsInterpreterEntryPoint(AsmJsCallStackLayout* stack)
    {
        JavascriptFunction * function = stack->functionObject;
        void * entryPoint = nullptr;
        switch (function->GetFunctionBody()->GetAsmJsFunctionInfo()->GetReturnType().which())
        {
        case Js::AsmJsRetType::Double:
        {
            entryPoint = (void*)(AsmJsInterpreterDoubleEP)Js::InterpreterStackFrame::AsmJsInterpreter < double >;
            break;
        }
        case Js::AsmJsRetType::Float:
        {
            entryPoint = (void*)(AsmJsInterpreterFloatEP)Js::InterpreterStackFrame::AsmJsInterpreter < float >;
            break;
        }
        case Js::AsmJsRetType::Signed:
        case Js::AsmJsRetType::Void:
        {
            entryPoint = (void*)(AsmJsInterpreterIntEP)Js::InterpreterStackFrame::AsmJsInterpreter < int >;
            break;
        }
        case Js::AsmJsRetType::Int64:
        {
            entryPoint = (void*)(AsmJsInterpreterInt64EP)Js::InterpreterStackFrame::AsmJsInterpreter < int64 >;
            break;
        }
#ifdef ENABLE_WASM_SIMD
        case Js::AsmJsRetType::Int32x4:
        case Js::AsmJsRetType::Bool32x4:
        case Js::AsmJsRetType::Bool16x8:
        case Js::AsmJsRetType::Bool8x16:
        case Js::AsmJsRetType::Float32x4:
        case Js::AsmJsRetType::Float64x2:
        case Js::AsmJsRetType::Int16x8:
        case Js::AsmJsRetType::Int8x16:
        case Js::AsmJsRetType::Uint32x4:
        case Js::AsmJsRetType::Uint16x8:
        case Js::AsmJsRetType::Uint8x16:
        {
            entryPoint = (void*)Js::InterpreterStackFrame::AsmJsInterpreterSimdJs;
            break;
        }
#endif
        default:
            Assume(UNREACHED);
        }
        return entryPoint;
    }